

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

bool __thiscall
QSocks5SocketEngine::waitForReadOrWrite
          (QSocks5SocketEngine *this,bool *readyToRead,bool *readyToWrite,bool checkRead,
          bool checkWrite,QDeadlineTimer deadline,bool *timedOut)

{
  long lVar1;
  byte bVar2;
  byte *in_RDX;
  byte *in_RSI;
  long *in_RDI;
  byte in_R8B;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  bool canWrite;
  bool canRead;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_R8B & 1) == 0) {
    bVar2 = (**(code **)(*in_RDI + 0x120))(in_RDI,in_stack_00000008,in_stack_00000010,in_R9);
    local_29 = (bool)(bVar2 & 1);
    if (in_RSI != (byte *)0x0) {
      *in_RSI = local_29;
    }
  }
  else {
    bVar2 = (**(code **)(*in_RDI + 0x128))(in_RDI,in_stack_00000008,in_stack_00000010,in_R9);
    local_29 = (bool)(bVar2 & 1);
    if (in_RDX != (byte *)0x0) {
      *in_RDX = local_29;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QSocks5SocketEngine::waitForReadOrWrite(bool *readyToRead, bool *readyToWrite,
                                            bool checkRead, bool checkWrite,
                                            QDeadlineTimer deadline, bool *timedOut)
{
    Q_UNUSED(checkRead);
    if (!checkWrite) {
        bool canRead = waitForRead(deadline, timedOut);
        if (readyToRead)
            *readyToRead = canRead;
        return canRead;
    }

    bool canWrite = waitForWrite(deadline, timedOut);
    if (readyToWrite)
        *readyToWrite = canWrite;
    return canWrite;
}